

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

bool __thiscall S2LatLngRect::Contains(S2LatLngRect *this,S2LatLng *ll)

{
  bool bVar1;
  ostream *poVar2;
  double dVar3;
  bool local_81;
  S1Angle local_58;
  S1Angle local_50 [3];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2LatLng *local_18;
  S2LatLng *ll_local;
  S2LatLngRect *this_local;
  
  local_18 = ll;
  ll_local = (S2LatLng *)this;
  bVar1 = S2LatLng::is_valid(ll);
  local_31 = 0;
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x8f,kError,(ostream *)&std::cerr);
    local_31 = 1;
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Invalid S2LatLng in S2LatLngRect::Contains: ");
    poVar2 = ::operator<<(poVar2,local_18);
    S2LogMessageVoidify::operator&(&local_19,poVar2);
  }
  if ((local_31 & 1) != 0) {
    S2LogMessage::~S2LogMessage(&local_30);
  }
  local_50[0] = S2LatLng::lat(local_18);
  dVar3 = S1Angle::radians(local_50);
  bVar1 = R1Interval::Contains(&this->lat_,dVar3);
  local_81 = false;
  if (bVar1) {
    local_58 = S2LatLng::lng(local_18);
    dVar3 = S1Angle::radians(&local_58);
    local_81 = S1Interval::Contains(&this->lng_,dVar3);
  }
  return local_81;
}

Assistant:

bool S2LatLngRect::Contains(const S2LatLng& ll) const {
  S2_DLOG_IF(ERROR, !ll.is_valid())
      << "Invalid S2LatLng in S2LatLngRect::Contains: " << ll;

  return (lat_.Contains(ll.lat().radians()) &&
          lng_.Contains(ll.lng().radians()));
}